

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int diamond_search_sad(FULLPEL_MV start_mv,uint start_mv_sad,FULLPEL_MOTION_SEARCH_PARAMS *ms_params
                      ,int search_step,int *num00,FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  FullMvLimits *mv_limits;
  MV_COST_PARAMS *mv_cost_params;
  int iVar1;
  int ref_stride;
  FULLPEL_MV FVar2;
  buf_2d *pbVar3;
  buf_2d *src;
  search_site_config *psVar4;
  uint8_t *puVar5;
  bool bVar6;
  int j;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  search_site *psVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int j_1;
  uint8_t *puVar22;
  FULLPEL_MV local_110;
  int local_e4;
  FULLPEL_MV local_a4;
  int *local_a0;
  int *local_98;
  search_site *local_90;
  int *local_88;
  ulong local_80;
  ulong local_78;
  FULLPEL_MOTION_SEARCH_PARAMS *local_70;
  uchar *block_offset [4];
  uint sads [4];
  
  pbVar3 = (ms_params->ms_buffers).ref;
  src = (ms_params->ms_buffers).src;
  psVar4 = ms_params->search_sites;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    local_110 = *second_best_mv;
  }
  puVar5 = src->buf;
  iVar1 = src->stride;
  ref_stride = pbVar3->stride;
  uVar18 = psVar4->num_search_steps - search_step;
  *best_mv = start_mv;
  mv_cost_params = &ms_params->mv_cost_params;
  puVar22 = pbVar3->buf + (((int)start_mv >> 0x10) + (int)start_mv.row * pbVar3->stride);
  local_a0 = num00;
  if ((ms_params->ms_buffers).second_pred == (uint8_t *)0x0) {
    mv_limits = &ms_params->mv_limits;
    local_88 = &psVar4->site[0][1].offset;
    local_90 = psVar4->site[0] + 1;
    local_98 = psVar4->searches_per_step + 0x14;
    local_e4 = 1;
    iVar17 = 0;
    local_70 = ms_params;
    while (0 < (int)uVar18) {
      local_78 = (ulong)uVar18;
      uVar18 = uVar18 - 1;
      uVar12 = (ulong)uVar18;
      uVar11 = psVar4->searches_per_step[uVar12];
      local_80 = uVar12;
      if (((((int)psVar4->site[uVar12][1].mv.row + (int)best_mv->row <
             (ms_params->mv_limits).row_min) ||
           ((ms_params->mv_limits).row_max < (int)psVar4->site[uVar12][2].mv.row + (int)best_mv->row
           )) || ((int)psVar4->site[uVar12][3].mv.col + (int)best_mv->col <
                  (ms_params->mv_limits).col_min)) ||
         ((ms_params->mv_limits).col_max < (int)psVar4->site[uVar12][4].mv.col + (int)best_mv->col))
      {
        uVar19 = 0;
        uVar21 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar21 = uVar19;
        }
        for (uVar16 = 1; iVar10 = (int)uVar19, uVar16 - uVar21 != 1; uVar16 = uVar16 + 1) {
          FVar2 = psVar4->site[uVar12][uVar16].mv;
          block_offset[0]._0_2_ = FVar2.row + (*best_mv).row;
          block_offset[0]._2_2_ = FVar2.col + (*best_mv).col;
          iVar10 = av1_is_fullmv_in_range(mv_limits,block_offset[0]._0_4_);
          if ((iVar10 != 0) &&
             (uVar11 = (*ms_params->sdf)(src->buf,src->stride,
                                         puVar22 + psVar4->site[uVar12][uVar16].offset,ref_stride),
             uVar11 < start_mv_sad)) {
            iVar10 = mvsad_err_cost_((FULLPEL_MV *)block_offset,mv_cost_params);
            if (iVar10 + uVar11 < start_mv_sad) {
              uVar19 = uVar16 & 0xffffffff;
              start_mv_sad = iVar10 + uVar11;
            }
          }
        }
      }
      else {
        piVar15 = local_88 + uVar12 * 0x22;
        psVar14 = local_90 + uVar12 * 0x11;
        iVar10 = 0;
        for (lVar20 = 1; lVar20 <= (int)uVar11; lVar20 = lVar20 + 4) {
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            block_offset[lVar13] = puVar22 + piVar15[lVar13 * 2];
          }
          (*ms_params->sdx4df)(puVar5,iVar1,block_offset,ref_stride,sads);
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            uVar7 = sads[lVar13];
            if (uVar7 < start_mv_sad) {
              local_a4.row = psVar14[lVar13].mv.row + (*best_mv).row;
              local_a4.col = psVar14[lVar13].mv.col + (*best_mv).col;
              iVar8 = mvsad_err_cost_(&local_a4,mv_cost_params);
              uVar7 = iVar8 + uVar7;
              if (uVar7 < start_mv_sad) {
                start_mv_sad = uVar7;
                iVar10 = (int)lVar13 + (int)lVar20;
              }
            }
          }
          piVar15 = piVar15 + 8;
          psVar14 = psVar14 + 4;
          ms_params = local_70;
        }
      }
      if (iVar10 == 0) {
        iVar17 = iVar17 + local_e4;
        if (3 < (int)local_78) {
          lVar20 = 0;
          while( true ) {
            iVar10 = (int)lVar20;
            uVar18 = (int)local_80 + iVar10;
            if (((int)uVar18 < 3) ||
               (local_98[(local_78 & 0xffffffff) + lVar20] != psVar4->radius[uVar18])) break;
            lVar20 = lVar20 + -1;
          }
          uVar18 = (int)local_80 + iVar10;
          iVar17 = iVar17 - iVar10;
        }
      }
      else {
        local_110 = *best_mv;
        best_mv->row = psVar4->site[uVar12][iVar10].mv.row + local_110.row;
        best_mv->col = local_110.col + psVar4->site[uVar12][iVar10].mv.col;
        puVar22 = puVar22 + psVar4->site[uVar12][iVar10].offset;
        local_e4 = 0;
      }
    }
  }
  else {
    iVar1 = 1;
    iVar17 = 0;
    while (0 < (int)uVar18) {
      uVar12 = (ulong)uVar18;
      uVar7 = uVar18 - 1;
      iVar10 = 0;
      uVar11 = psVar4->searches_per_step[uVar7];
      if (psVar4->searches_per_step[uVar7] < 1) {
        uVar11 = 0;
      }
      for (lVar20 = 1; lVar20 - (ulong)uVar11 != 1; lVar20 = lVar20 + 1) {
        FVar2 = psVar4->site[uVar7][lVar20].mv;
        block_offset[0]._0_2_ = FVar2.row + (*best_mv).row;
        block_offset[0]._2_2_ = FVar2.col + (*best_mv).col;
        iVar8 = av1_is_fullmv_in_range(&ms_params->mv_limits,block_offset[0]._0_4_);
        if ((iVar8 != 0) &&
           (uVar9 = get_mvpred_compound_sad
                              (ms_params,src,puVar22 + psVar4->site[uVar7][lVar20].offset,ref_stride
                              ), uVar9 < start_mv_sad)) {
          iVar8 = mvsad_err_cost_((FULLPEL_MV *)block_offset,mv_cost_params);
          if (iVar8 + uVar9 < start_mv_sad) {
            iVar10 = (int)lVar20;
            start_mv_sad = iVar8 + uVar9;
          }
        }
      }
      if (iVar10 == 0) {
        iVar17 = iVar17 + iVar1;
        bVar6 = 3 < (int)uVar18;
        uVar18 = uVar7;
        if (bVar6) {
          lVar20 = 0;
          while( true ) {
            iVar10 = (int)lVar20;
            if (((int)(uVar7 + iVar10) < 3) ||
               (psVar4->searches_per_step[uVar12 + lVar20 + 0x14] != psVar4->radius[uVar7 + iVar10])
               ) break;
            lVar20 = lVar20 + -1;
          }
          iVar17 = iVar17 - iVar10;
          uVar18 = uVar7 + iVar10;
        }
      }
      else {
        local_110 = *best_mv;
        best_mv->row = psVar4->site[uVar7][iVar10].mv.row + local_110.row;
        best_mv->col = local_110.col + psVar4->site[uVar7][iVar10].mv.col;
        puVar22 = puVar22 + psVar4->site[uVar7][iVar10].offset;
        iVar1 = 0;
        uVar18 = uVar7;
      }
    }
  }
  *local_a0 = iVar17;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    *second_best_mv = local_110;
  }
  return (int)second_best_mv;
}

Assistant:

static int diamond_search_sad(FULLPEL_MV start_mv, unsigned int start_mv_sad,
                              const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                              const int search_step, int *num00,
                              FULLPEL_MV *best_mv, FULLPEL_MV *second_best_mv) {
#define UPDATE_SEARCH_STEP                                      \
  do {                                                          \
    if (best_site != 0) {                                       \
      tmp_second_best_mv = *best_mv;                            \
      best_mv->row += site[best_site].mv.row;                   \
      best_mv->col += site[best_site].mv.col;                   \
      best_address += site[best_site].offset;                   \
      is_off_center = 1;                                        \
    }                                                           \
                                                                \
    if (is_off_center == 0) num_center_steps++;                 \
                                                                \
    if (best_site == 0 && step > 2) {                           \
      int next_step_size = cfg->radius[step - 1];               \
      while (next_step_size == cfg->radius[step] && step > 2) { \
        num_center_steps++;                                     \
        --step;                                                 \
        next_step_size = cfg->radius[step - 1];                 \
      }                                                         \
    }                                                           \
  } while (0)

  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;

  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;

  const search_site_config *cfg = ms_params->search_sites;

  int is_off_center = 0;
  // Number of times that we have stayed in the middle. This is used to skip
  // search steps in the future if diamond_search_sad is called again.
  int num_center_steps = 0;

  // search_step determines the length of the initial step and hence the number
  // of iterations.
  const int tot_steps = cfg->num_search_steps - search_step;
  FULLPEL_MV tmp_second_best_mv;
  if (second_best_mv) {
    tmp_second_best_mv = *second_best_mv;
  }

  *best_mv = start_mv;

  // Check the starting position
  const uint8_t *best_address = get_buf_from_fullmv(ref, &start_mv);
  unsigned int bestsad = start_mv_sad;

  // TODO(chiyotsai@google.com): Implement 4 points search for msdf&sdaf
  if (ms_params->ms_buffers.second_pred) {
    for (int step = tot_steps - 1; step >= 0; --step) {
      const search_site *site = cfg->site[step];
      const int num_searches = cfg->searches_per_step[step];
      int best_site = 0;

      for (int idx = 1; idx <= num_searches; idx++) {
        const FULLPEL_MV this_mv = { best_mv->row + site[idx].mv.row,
                                     best_mv->col + site[idx].mv.col };

        if (av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
          const uint8_t *const check_here = site[idx].offset + best_address;
          unsigned int thissad =
              get_mvpred_compound_sad(ms_params, src, check_here, ref_stride);

          if (thissad < bestsad) {
            thissad += mvsad_err_cost_(&this_mv, mv_cost_params);
            if (thissad < bestsad) {
              bestsad = thissad;
              best_site = idx;
            }
          }
        }
      }
      UPDATE_SEARCH_STEP;
    }
  } else {
    for (int step = tot_steps - 1; step >= 0; --step) {
      const search_site *site = cfg->site[step];
      const int num_searches = cfg->searches_per_step[step];
      int best_site = 0;

      int all_in = 1;
      // Trap illegal vectors
      all_in &= best_mv->row + site[1].mv.row >= ms_params->mv_limits.row_min;
      all_in &= best_mv->row + site[2].mv.row <= ms_params->mv_limits.row_max;
      all_in &= best_mv->col + site[3].mv.col >= ms_params->mv_limits.col_min;
      all_in &= best_mv->col + site[4].mv.col <= ms_params->mv_limits.col_max;

      if (all_in) {
        for (int idx = 1; idx <= num_searches; idx += 4) {
          unsigned char const *block_offset[4];
          unsigned int sads[4];

          for (int j = 0; j < 4; j++)
            block_offset[j] = site[idx + j].offset + best_address;

          ms_params->sdx4df(src_buf, src_stride, block_offset, ref_stride,
                            sads);
          for (int j = 0; j < 4; j++) {
            if (sads[j] < bestsad) {
              const FULLPEL_MV this_mv = { best_mv->row + site[idx + j].mv.row,
                                           best_mv->col +
                                               site[idx + j].mv.col };
              unsigned int thissad =
                  sads[j] + mvsad_err_cost_(&this_mv, mv_cost_params);
              if (thissad < bestsad) {
                bestsad = thissad;
                best_site = idx + j;
              }
            }
          }
        }
      } else {
        for (int idx = 1; idx <= num_searches; idx++) {
          const FULLPEL_MV this_mv = { best_mv->row + site[idx].mv.row,
                                       best_mv->col + site[idx].mv.col };

          if (av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
            const uint8_t *const check_here = site[idx].offset + best_address;
            unsigned int thissad =
                get_mvpred_sad(ms_params, src, check_here, ref_stride);

            if (thissad < bestsad) {
              thissad += mvsad_err_cost_(&this_mv, mv_cost_params);
              if (thissad < bestsad) {
                bestsad = thissad;
                best_site = idx;
              }
            }
          }
        }
      }
      UPDATE_SEARCH_STEP;
    }
  }

  *num00 = num_center_steps;
  if (second_best_mv) {
    *second_best_mv = tmp_second_best_mv;
  }

  return bestsad;

#undef UPDATE_SEARCH_STEP
}